

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Cart_create(MPIABI_Comm comm_old,int ndims,int *dims,int *periods,int reorder,
                      MPIABI_Comm *comm_cart)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  ompi_communicator_t *poVar5;
  ompi_communicator_t **ppoVar6;
  WPI_HandlePtr<ompi_communicator_t_*> local_48;
  WPI_Handle local_40 [8];
  MPIABI_Comm *local_38;
  MPIABI_Comm *comm_cart_local;
  int *piStack_28;
  int reorder_local;
  int *periods_local;
  int *dims_local;
  MPIABI_Comm MStack_10;
  int ndims_local;
  MPIABI_Comm comm_old_local;
  
  local_38 = comm_cart;
  comm_cart_local._4_4_ = reorder;
  piStack_28 = periods;
  periods_local = dims;
  dims_local._4_4_ = ndims;
  MStack_10 = comm_old;
  WPI_Handle<ompi_communicator_t_*>::WPI_Handle
            ((WPI_Handle<ompi_communicator_t_*> *)local_40,comm_old);
  poVar5 = WPI_Handle::operator_cast_to_ompi_communicator_t_(local_40);
  iVar3 = dims_local._4_4_;
  piVar2 = periods_local;
  piVar1 = piStack_28;
  iVar4 = comm_cart_local._4_4_;
  WPI_HandlePtr<ompi_communicator_t_*>::WPI_HandlePtr(&local_48,local_38);
  ppoVar6 = WPI_HandlePtr::operator_cast_to_ompi_communicator_t__((WPI_HandlePtr *)&local_48);
  iVar4 = MPI_Cart_create(poVar5,iVar3,piVar2,piVar1,iVar4,ppoVar6);
  WPI_HandlePtr<ompi_communicator_t_*>::~WPI_HandlePtr(&local_48);
  return iVar4;
}

Assistant:

int MPIABI_Cart_create(
  MPIABI_Comm comm_old,
  int ndims,
  const int * dims,
  const int * periods,
  int reorder,
  MPIABI_Comm * comm_cart
) {
  return MPI_Cart_create(
    (MPI_Comm)(WPI_Comm)comm_old,
    ndims,
    dims,
    periods,
    reorder,
    (MPI_Comm *)(WPI_CommPtr)comm_cart
  );
}